

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

TestCase *
Catch::makeTestCase(TestCase *__return_storage_ptr__,ITestCase *_testCase,string *_className,
                   string *_name,string *_descOrTags,SourceLineInfo *_lineInfo)

{
  char cVar1;
  string *_name_00;
  TestCase *this;
  bool bVar2;
  SpecialProperties SVar3;
  bool bVar4;
  bool bVar5;
  size_t i;
  ulong uVar6;
  string tag;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tags;
  string desc;
  TestCaseInfo info;
  allocator<char> local_1d9;
  SourceLineInfo *local_1d8;
  ITestCase *local_1d0;
  string *local_1c8;
  string *local_1c0;
  TestCase *local_1b8;
  string local_1b0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_190;
  string local_160;
  TestCaseInfo local_140;
  
  local_1d8 = _lineInfo;
  local_1d0 = _testCase;
  local_1c8 = _className;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_140,"./",(allocator<char> *)&local_190);
  local_1c0 = _name;
  local_1b8 = __return_storage_ptr__;
  bVar2 = startsWith(_name,&local_140.name);
  std::__cxx11::string::~string((string *)&local_140);
  local_190._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_190._M_impl.super__Rb_tree_header._M_header;
  local_190._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_190._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_190._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
  local_160._M_string_length = 0;
  local_160.field_2._M_local_buf[0] = '\0';
  local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
  local_1b0._M_string_length = 0;
  local_1b0.field_2._M_local_buf[0] = '\0';
  bVar4 = false;
  local_190._M_impl.super__Rb_tree_header._M_header._M_right =
       local_190._M_impl.super__Rb_tree_header._M_header._M_left;
  for (uVar6 = 0; this = local_1b8, _name_00 = local_1c0, uVar6 < _descOrTags->_M_string_length;
      uVar6 = uVar6 + 1) {
    cVar1 = (_descOrTags->_M_dataplus)._M_p[uVar6];
    if (bVar4) {
      if (cVar1 == ']') {
        SVar3 = parseSpecialTag(&local_1b0);
        if (SVar3 == None) {
          enforceNotReservedTag(&local_1b0,local_1d8);
          bVar5 = bVar2;
        }
        else {
          bVar5 = true;
          if (SVar3 != IsHidden) {
            bVar5 = bVar2;
          }
        }
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&local_190,&local_1b0);
        local_1b0._M_string_length = 0;
        *local_1b0._M_dataplus._M_p = '\0';
        bVar4 = false;
        bVar2 = bVar5;
      }
      else {
        bVar4 = true;
        std::__cxx11::string::push_back((char)&local_1b0);
      }
    }
    else {
      bVar4 = true;
      if (cVar1 != '[') {
        std::__cxx11::string::push_back((char)&local_160);
        bVar4 = false;
      }
    }
  }
  if (bVar2 != false) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_140,"hide",&local_1d9);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&local_190,&local_140.name);
    std::__cxx11::string::~string((string *)&local_140);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_140,".",&local_1d9);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&local_190,&local_140.name);
    std::__cxx11::string::~string((string *)&local_140);
  }
  TestCaseInfo::TestCaseInfo
            (&local_140,_name_00,local_1c8,&local_160,
             (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_190,local_1d8);
  TestCase::TestCase(this,local_1d0,&local_140);
  TestCaseInfo::~TestCaseInfo(&local_140);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_160);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_190);
  return this;
}

Assistant:

TestCase makeTestCase(  ITestCase* _testCase,
                            std::string const& _className,
                            std::string const& _name,
                            std::string const& _descOrTags,
                            SourceLineInfo const& _lineInfo )
    {
        bool isHidden( startsWith( _name, "./" ) ); // Legacy support

        // Parse out tags
        std::set<std::string> tags;
        std::string desc, tag;
        bool inTag = false;
        for( std::size_t i = 0; i < _descOrTags.size(); ++i ) {
            char c = _descOrTags[i];
            if( !inTag ) {
                if( c == '[' )
                    inTag = true;
                else
                    desc += c;
            }
            else {
                if( c == ']' ) {
                    TestCaseInfo::SpecialProperties prop = parseSpecialTag( tag );
                    if( prop == TestCaseInfo::IsHidden )
                        isHidden = true;
                    else if( prop == TestCaseInfo::None )
                        enforceNotReservedTag( tag, _lineInfo );

                    tags.insert( tag );
                    tag.clear();
                    inTag = false;
                }
                else
                    tag += c;
            }
        }
        if( isHidden ) {
            tags.insert( "hide" );
            tags.insert( "." );
        }

        TestCaseInfo info( _name, _className, desc, tags, _lineInfo );
        return TestCase( _testCase, info );
    }